

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

uint * stack(uint *a,uint alen,uint *b,uint blen,uint *out_size)

{
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  uint *puVar4;
  
  uVar3 = blen + alen;
  if (out_size != (uint *)0x0) {
    *out_size = uVar3;
  }
  puVar1 = (uint *)calloc((ulong)uVar3,4);
  if (uVar3 != 0) {
    uVar2 = 0;
    do {
      puVar4 = b + ((int)uVar2 - alen);
      if (uVar2 < alen) {
        puVar4 = a;
      }
      puVar1[uVar2] = *puVar4;
      uVar2 = uVar2 + 1;
      a = a + 1;
    } while (uVar3 != uVar2);
  }
  return puVar1;
}

Assistant:

uint32_t *stack(uint32_t *a, uint32_t alen, uint32_t *b, uint32_t blen, uint32_t *out_size)
{
    uint32_t size = alen + blen;
    if (out_size != NULL)
        *out_size = alen + blen;

    uint32_t *c = vector_new(size);

    for (uint32_t i = 0; i < size; i++)
        c[i] = i < alen ? a[i] : b[i - alen];
    return c;
}